

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::btranL(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsInt *h_start;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  bool bVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                      (factor_timer_clock_pointer->clock_).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[0x1a]);
  }
  if (((0.1 < expected_density) || (rhs->count < 0)) ||
     (0.05 < (double)rhs->count * this->inv_num_row)) {
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x1c]);
    }
    if ((long)this->num_row < 1) {
      iVar12 = 0;
    }
    else {
      piVar4 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = 0;
      lVar11 = (long)this->num_row;
      do {
        iVar2 = piVar9[lVar11 + -1];
        dVar1 = pdVar5[iVar2];
        if (ABS(dVar1) <= 1e-14) {
          pdVar5[iVar2] = 0.0;
        }
        else {
          lVar13 = (long)iVar12;
          iVar12 = iVar12 + 1;
          piVar4[lVar13] = iVar2;
          iVar2 = piVar6[lVar11 + -1];
          lVar13 = (long)iVar2;
          iVar3 = piVar6[lVar11];
          if (iVar2 < iVar3) {
            do {
              iVar2 = piVar7[lVar13];
              pdVar5[iVar2] = pdVar8[lVar13] * -dVar1 + pdVar5[iVar2];
              lVar13 = lVar13 + 1;
            } while (iVar3 != lVar13);
          }
        }
        bVar10 = 1 < lVar11;
        lVar11 = lVar11 + -1;
      } while (bVar10);
    }
    rhs->count = iVar12;
    lVar11 = 0x70;
  }
  else {
    if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x1d]);
    }
    h_start = (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    solveHyper(this->num_row,
               (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(double *)0x0,h_start,h_start + 1,
               (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,rhs);
    lVar11 = 0x74;
  }
  if (factor_timer_clock_pointer != (HighsTimerClock *)0x0) {
    HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                     *(HighsInt *)
                      ((long)(factor_timer_clock_pointer->clock_).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar11));
  }
  if (this->update_method == 4) {
    if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
      btranAPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
    }
    else {
      HighsTimer::start(factor_timer_clock_pointer->timer_pointer_,
                        (factor_timer_clock_pointer->clock_).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[0x1e]);
      btranAPF(this,rhs);
      HVectorBase<double>::tight(rhs);
      HVectorBase<double>::pack(rhs);
      HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                       (factor_timer_clock_pointer->clock_).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[0x1e]);
    }
  }
  if (factor_timer_clock_pointer == (HighsTimerClock *)0x0) {
    return;
  }
  HighsTimer::stop(factor_timer_clock_pointer->timer_pointer_,
                   (factor_timer_clock_pointer->clock_).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[0x1a]);
  return;
}

Assistant:

void HFactor::btranL(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranLower, factor_timer_clock_pointer);

  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranL;
  if (sparse_solve) {
    factor_timer.start(FactorBtranLowerSps, factor_timer_clock_pointer);
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor L
    const HighsInt* lr_start = this->lr_start.data();
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    for (HighsInt i = num_row - 1; i >= 0; i--) {
      HighsInt pivotRow = l_pivot_index[i];
      const double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = lr_start[i];
        const HighsInt end = lr_start[i + 1];
        for (HighsInt k = start; k < end; k++)
          rhs_array[lr_index[k]] -= pivot_multiplier * lr_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    factor_timer.stop(FactorBtranLowerSps, factor_timer_clock_pointer);
  } else {
    // Hyper-sparse solve
    factor_timer.start(FactorBtranLowerHyper, factor_timer_clock_pointer);
    const HighsInt* lr_index = this->lr_index.data();
    const double* lr_value = this->lr_value.data();
    solveHyper(num_row, l_pivot_lookup.data(), l_pivot_index.data(), 0,
               lr_start.data(), &lr_start[1], &lr_index[0], &lr_value[0], &rhs);
    factor_timer.stop(FactorBtranLowerHyper, factor_timer_clock_pointer);
  }

  if (update_method == kUpdateMethodApf) {
    factor_timer.start(FactorBtranLowerAPF, factor_timer_clock_pointer);
    btranAPF(rhs);
    rhs.tight();
    rhs.pack();
    factor_timer.stop(FactorBtranLowerAPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranLower, factor_timer_clock_pointer);
}